

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O3

bool __thiscall QCborStreamReaderPrivate::ensureStringIteration(QCborStreamReaderPrivate *this)

{
  size_type *psVar1;
  byte bVar2;
  QCborStreamReaderPrivate *this_00;
  
  bVar2 = (this->currentElement).flags;
  if (((bVar2 & 8) == 0) && ((this->currentElement).flags = bVar2 | 0xc, (bVar2 & 0x10) != 0)) {
    this_00 = (QCborStreamReaderPrivate *)(this->currentElement).source.ptr;
    psVar1 = &this_00->bufferStart;
    *psVar1 = *psVar1 + 1;
    preread(this_00);
  }
  return true;
}

Assistant:

bool QCborStreamReaderPrivate::ensureStringIteration()
{
    if (currentElement.flags & CborIteratorFlag_IteratingStringChunks)
        return true;

    CborError err = cbor_value_begin_string_iteration(&currentElement);
    if (!err)
        return true;
    handleError(err);
    return false;
}